

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

char * Supp_ManFetch(Supp_Man_t *p,int nSize)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  void **ppvVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x78,"char *Supp_ManFetch(Supp_Man_t *, int)");
  }
  iVar7 = nSize / p->nStepSize;
  bVar2 = 0 < nSize % p->nStepSize;
  uVar6 = iVar7 + (uint)bVar2;
  pVVar1 = p->vFree;
  if (pVVar1->nSize <= (int)uVar6) {
    iVar9 = iVar7 + (uint)bVar2 + 1;
    iVar7 = pVVar1->nCap;
    iVar8 = iVar7 * 2;
    if ((int)uVar6 < iVar8) {
      if (iVar7 < iVar8 && iVar7 <= (int)uVar6) {
        if (pVVar1->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((long)iVar7 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar1->pArray,(long)iVar7 << 4);
        }
        pVVar1->pArray = ppvVar3;
LAB_002e7982:
        pVVar1->nCap = iVar8;
      }
    }
    else if (iVar7 <= (int)uVar6) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((long)iVar9 << 3);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,(long)iVar9 << 3);
      }
      pVVar1->pArray = ppvVar3;
      iVar8 = iVar9;
      goto LAB_002e7982;
    }
    lVar4 = (long)pVVar1->nSize;
    if (pVVar1->nSize <= (int)uVar6) {
      do {
        pVVar1->pArray[lVar4] = (void *)0x0;
        lVar4 = lVar4 + 1;
      } while (iVar9 != lVar4);
    }
    pVVar1->nSize = iVar9;
  }
  if (((int)uVar6 < 0) || (p->vFree->nSize <= (int)uVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar3 = p->vFree->pArray;
  pcVar5 = (char *)ppvVar3[uVar6];
  if (pcVar5 != (char *)0x0) {
    ppvVar3[uVar6] = *(void **)pcVar5;
    return pcVar5;
  }
  lVar4 = (long)(int)uVar6 * (long)p->nStepSize;
  iVar7 = (int)lVar4;
  if (iVar7 <= p->nFreeSize) goto LAB_002e7a85;
  iVar8 = p->nChunkSize;
  pcVar5 = (char *)malloc((long)iVar8);
  p->pFreeBuf = pcVar5;
  p->nFreeSize = iVar8;
  pVVar1 = p->vMemory;
  uVar6 = pVVar1->nCap;
  if (pVVar1->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar3;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar6 * 2;
      if (iVar8 <= (int)uVar6) goto LAB_002e7a72;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,(ulong)uVar6 << 4);
      }
      pVVar1->pArray = ppvVar3;
    }
    pVVar1->nCap = iVar8;
  }
LAB_002e7a72:
  iVar8 = pVVar1->nSize;
  pVVar1->nSize = iVar8 + 1;
  pVVar1->pArray[iVar8] = pcVar5;
LAB_002e7a85:
  if (iVar7 <= p->nFreeSize) {
    pcVar5 = p->pFreeBuf;
    p->pFreeBuf = pcVar5 + lVar4;
    p->nFreeSize = p->nFreeSize - iVar7;
    return pcVar5;
  }
  __assert_fail("p->nFreeSize >= nSizeReal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                ,0x87,"char *Supp_ManFetch(Supp_Man_t *, int)");
}

Assistant:

char * Supp_ManFetch( Supp_Man_t * p, int nSize )
{
    int Type, nSizeReal;
    char * pMemory;
    assert( nSize > 0 );
    Type = Supp_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    if ( (pMemory = (char *)Vec_PtrEntry( p->vFree, Type )) )
    {
        Vec_PtrWriteEntry( p->vFree, Type, Supp_OneNext(pMemory) );
        return pMemory;
    }
    nSizeReal = p->nStepSize * Type;
    if ( p->nFreeSize < nSizeReal )
    {
        p->pFreeBuf = ABC_ALLOC( char, p->nChunkSize );
        p->nFreeSize = p->nChunkSize;
        Vec_PtrPush( p->vMemory, p->pFreeBuf );
    }
    assert( p->nFreeSize >= nSizeReal );
    pMemory = p->pFreeBuf;
    p->pFreeBuf  += nSizeReal;
    p->nFreeSize -= nSizeReal;
    return pMemory;
}